

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::blitFramebuffer
          (ReferenceContext *this,int srcX0,int srcY0,int srcX1,int srcY1,int dstX0,int dstY0,
          int dstX1,int dstY1,deUint32 mask,deUint32 filter)

{
  ChannelOrder CVar1;
  TextureFormat format;
  ChannelOrder CVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  TextureChannelClass TVar6;
  float *pfVar7;
  ChannelType *pCVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int height;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int width;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 uVar30;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  Matrix<float,_3,_3> res;
  PixelBufferAccess dst;
  IVec4 local_118;
  IVec4 local_108;
  MultisampleConstPixelBufferAccess src_1;
  Matrix<float,_3,_3> res_1;
  undefined4 uStack_94;
  Vec4 local_88;
  Mat3 transform;
  long lVar29;
  
  iVar21 = dstY1 - dstY0;
  iVar16 = dstY0;
  if (dstY1 < dstY0) {
    iVar16 = dstY1;
  }
  iVar22 = dstX1 - dstX0;
  iVar18 = dstX0;
  if (dstX1 < dstX0) {
    iVar18 = dstX1;
  }
  iVar20 = srcY1 - srcY0;
  iVar17 = srcY0;
  if (srcY1 < srcY0) {
    iVar17 = srcY1;
  }
  iVar23 = srcX1 - srcX0;
  iVar15 = srcX0;
  if (srcX1 < srcX0) {
    iVar15 = srcX1;
  }
  width = -iVar23;
  if (0 < iVar23) {
    width = iVar23;
  }
  local_1bc = -iVar20;
  if (0 < iVar20) {
    local_1bc = iVar20;
  }
  local_1b0 = -iVar22;
  if (0 < iVar22) {
    local_1b0 = iVar22;
  }
  height = -iVar21;
  if (0 < iVar21) {
    height = iVar21;
  }
  bVar24 = local_1bc != height || width != local_1b0;
  if (filter - 0x2602 < 0xfffffffe) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x500;
    return;
  }
  if ((mask & 0x500) != 0 && filter != 0x2600) goto LAB_004dac80;
  local_118.m_data[0] = iVar18;
  local_118.m_data[1] = iVar16;
  local_118.m_data[2] = local_1b0;
  local_108.m_data[0] = iVar15;
  local_108.m_data[1] = iVar17;
  local_108.m_data[2] = width;
  iVar5 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca9);
  if (((iVar5 != 0x8cd5) ||
      (iVar5 = (*(this->super_Context)._vptr_Context[0x21])(this,0x8ca8), iVar5 != 0x8cd5)) ||
     (getDrawColorbuffer((MultisamplePixelBufferAccess *)&src_1,this),
     src_1.m_access.m_size.m_data[0] != 1)) {
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x502;
    return;
  }
  getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
  if (src_1.m_access.m_size.m_data[0] != 1) {
    if (bVar24) goto LAB_004dac80;
    if ((mask & 0x4000) != 0) {
      getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
      getDrawColorbuffer((MultisamplePixelBufferAccess *)&res,this);
      if ((float)src_1.m_access.m_format.order != res.m_data.m_data[0].m_data[0]) goto LAB_004db7a3;
      if ((float)src_1.m_access.m_format.type != res.m_data.m_data[0].m_data[1]) goto LAB_004db7a3;
    }
    if ((mask >> 8 & 1) != 0) {
      getReadDepthbuffer((MultisamplePixelBufferAccess *)&src_1,this);
      getDrawDepthbuffer((MultisamplePixelBufferAccess *)&res,this);
      if ((float)src_1.m_access.m_format.order != res.m_data.m_data[0].m_data[0]) {
LAB_004db7a3:
        if (this->m_lastError == 0) {
          this->m_lastError = 0x502;
        }
        return;
      }
      if ((float)src_1.m_access.m_format.type != res.m_data.m_data[0].m_data[1]) goto LAB_004db7a3;
    }
    if ((mask >> 10 & 1) != 0) {
      getReadStencilbuffer((MultisamplePixelBufferAccess *)&src_1,this);
      getDrawStencilbuffer((MultisamplePixelBufferAccess *)&res,this);
      if ((float)src_1.m_access.m_format.order != res.m_data.m_data[0].m_data[0]) {
LAB_004dac80:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
      if ((float)src_1.m_access.m_format.type != res.m_data.m_data[0].m_data[1]) goto LAB_004dac80;
    }
  }
  uVar12 = mask & 0x4000;
  local_1b4 = iVar15;
  local_1b8 = iVar17;
  if (uVar12 != 0) {
    getReadColorbuffer((MultisamplePixelBufferAccess *)&res,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    local_1b4 = 0;
    if (0 < iVar15) {
      local_1b4 = iVar15;
    }
    local_1b8 = 0;
    if (0 < iVar17) {
      local_1b8 = iVar17;
    }
    iVar5 = width + iVar15;
    if (src_1.m_access.m_size.m_data[1] <= width + iVar15) {
      iVar5 = src_1.m_access.m_size.m_data[1];
    }
    iVar15 = local_1bc + iVar17;
    if (src_1.m_access.m_size.m_data[2] <= local_1bc + iVar17) {
      iVar15 = src_1.m_access.m_size.m_data[2];
    }
    width = iVar5 - local_1b4;
    if (width < 1) {
      width = 0;
    }
    local_1bc = iVar15 - local_1b8;
    if (local_1bc < 1) {
      local_1bc = 0;
    }
  }
  local_108.m_data[0] = local_1b4;
  local_108.m_data[1] = local_1b8;
  local_108.m_data[2] = width;
  local_108.m_data[3] = local_1bc;
  if ((mask >> 8 & 1) != 0) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&res,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar17 = 0;
    if (0 < local_1b4) {
      iVar17 = local_1b4;
    }
    iVar15 = 0;
    if (0 < local_1b8) {
      iVar15 = local_1b8;
    }
    iVar5 = width + local_1b4;
    if (src_1.m_access.m_size.m_data[1] <= width + local_1b4) {
      iVar5 = src_1.m_access.m_size.m_data[1];
    }
    iVar13 = local_1bc + local_1b8;
    if (src_1.m_access.m_size.m_data[2] <= local_1bc + local_1b8) {
      iVar13 = src_1.m_access.m_size.m_data[2];
    }
    width = iVar5 - iVar17;
    if (width < 1) {
      width = 0;
    }
    local_1bc = iVar13 - iVar15;
    local_1b8 = iVar15;
    local_1b4 = iVar17;
    if (local_1bc < 1) {
      local_1bc = 0;
    }
  }
  if ((mask >> 10 & 1) != 0) {
    getReadStencilbuffer((MultisamplePixelBufferAccess *)&res,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar17 = 0;
    if (0 < local_1b4) {
      iVar17 = local_1b4;
    }
    iVar15 = 0;
    if (0 < local_1b8) {
      iVar15 = local_1b8;
    }
    iVar5 = width + local_1b4;
    if (src_1.m_access.m_size.m_data[1] <= width + local_1b4) {
      iVar5 = src_1.m_access.m_size.m_data[1];
    }
    iVar13 = local_1bc + local_1b8;
    if (src_1.m_access.m_size.m_data[2] <= local_1bc + local_1b8) {
      iVar13 = src_1.m_access.m_size.m_data[2];
    }
    width = iVar5 - iVar17;
    if (width < 1) {
      width = 0;
    }
    local_1bc = iVar13 - iVar15;
    local_1b8 = iVar15;
    local_1b4 = iVar17;
    if (local_1bc < 1) {
      local_1bc = 0;
    }
  }
  iVar17 = iVar18;
  iVar15 = iVar16;
  local_108.m_data[0] = local_1b4;
  local_108.m_data[1] = local_1b8;
  local_108.m_data[2] = width;
  local_108.m_data[3] = local_1bc;
  if (uVar12 != 0) {
    getDrawColorbuffer((MultisamplePixelBufferAccess *)&res,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar17 = 0;
    if (0 < iVar18) {
      iVar17 = iVar18;
    }
    iVar15 = 0;
    if (0 < iVar16) {
      iVar15 = iVar16;
    }
    iVar5 = local_1b0 + iVar18;
    if (src_1.m_access.m_size.m_data[1] <= local_1b0 + iVar18) {
      iVar5 = src_1.m_access.m_size.m_data[1];
    }
    iVar18 = height + iVar16;
    if (src_1.m_access.m_size.m_data[2] <= height + iVar16) {
      iVar18 = src_1.m_access.m_size.m_data[2];
    }
    local_1b0 = iVar5 - iVar17;
    if (local_1b0 < 1) {
      local_1b0 = 0;
    }
    height = iVar18 - iVar15;
    if (height < 1) {
      height = 0;
    }
  }
  local_118.m_data[0] = iVar17;
  local_118.m_data[1] = iVar15;
  local_118.m_data[2] = local_1b0;
  local_118.m_data[3] = height;
  if ((mask >> 8 & 1) != 0) {
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&res,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar16 = 0;
    if (0 < iVar17) {
      iVar16 = iVar17;
    }
    iVar18 = 0;
    if (0 < iVar15) {
      iVar18 = iVar15;
    }
    iVar5 = local_1b0 + iVar17;
    if (src_1.m_access.m_size.m_data[1] <= local_1b0 + iVar17) {
      iVar5 = src_1.m_access.m_size.m_data[1];
    }
    iVar17 = height + iVar15;
    if (src_1.m_access.m_size.m_data[2] <= height + iVar15) {
      iVar17 = src_1.m_access.m_size.m_data[2];
    }
    local_1b0 = iVar5 - iVar16;
    if (local_1b0 < 1) {
      local_1b0 = 0;
    }
    height = iVar17 - iVar18;
    iVar15 = iVar18;
    iVar17 = iVar16;
    if (height < 1) {
      height = 0;
    }
  }
  if ((mask >> 10 & 1) != 0) {
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&res,this);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    iVar16 = 0;
    if (0 < iVar17) {
      iVar16 = iVar17;
    }
    iVar18 = 0;
    if (0 < iVar15) {
      iVar18 = iVar15;
    }
    iVar5 = local_1b0 + iVar17;
    if (src_1.m_access.m_size.m_data[1] <= local_1b0 + iVar17) {
      iVar5 = src_1.m_access.m_size.m_data[1];
    }
    iVar17 = height + iVar15;
    if (src_1.m_access.m_size.m_data[2] <= height + iVar15) {
      iVar17 = src_1.m_access.m_size.m_data[2];
    }
    local_1b0 = iVar5 - iVar16;
    if (local_1b0 < 1) {
      local_1b0 = 0;
    }
    height = iVar17 - iVar18;
    iVar15 = iVar18;
    iVar17 = iVar16;
    if (height < 1) {
      height = 0;
    }
  }
  iVar16 = iVar17;
  iVar18 = iVar15;
  if (this->m_scissorEnabled == true) {
    iVar5 = (this->m_scissorBox).m_data[0];
    iVar13 = (this->m_scissorBox).m_data[1];
    iVar16 = iVar5;
    if (iVar5 < iVar17) {
      iVar16 = iVar17;
    }
    iVar18 = iVar13;
    if (iVar13 < iVar15) {
      iVar18 = iVar15;
    }
    iVar5 = iVar5 + (this->m_scissorBox).m_data[2];
    if (local_1b0 + iVar17 < iVar5) {
      iVar5 = local_1b0 + iVar17;
    }
    iVar13 = iVar13 + (this->m_scissorBox).m_data[3];
    if (height + iVar15 < iVar13) {
      iVar13 = height + iVar15;
    }
    local_1b0 = iVar5 - iVar16;
    if (iVar5 - iVar16 < 1) {
      local_1b0 = 0;
    }
    height = iVar13 - iVar18;
    if (height < 1) {
      height = 0;
    }
  }
  if (width == 0) {
    return;
  }
  if (local_1bc == 0) {
    return;
  }
  if (local_1b0 == 0) {
    return;
  }
  if (height == 0) {
    return;
  }
  local_118.m_data[0] = iVar16;
  local_118.m_data[1] = iVar18;
  local_118.m_data[2] = local_1b0;
  local_118.m_data[3] = height;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&src_1,this);
  if (src_1.m_access.m_size.m_data[0] != 1) {
    blitResolveMultisampleFramebuffer
              (this,mask,&local_108,&local_118,srcX1 < srcX0 != dstX1 < dstX0,
               srcY1 < srcY0 != dstY1 < dstY0);
    return;
  }
  pfVar7 = (float *)&res;
  res.m_data.m_data[1].m_data[1] = 0.0;
  res.m_data.m_data[1].m_data[2] = 0.0;
  res.m_data.m_data[0].m_data[0] = 0.0;
  res.m_data.m_data[0].m_data[1] = 0.0;
  res.m_data.m_data[0].m_data[2] = 0.0;
  res.m_data.m_data[1].m_data[0] = 0.0;
  stack0xfffffffffffffe88 = (void *)((ulong)stack0xfffffffffffffe88 & 0xffffffff00000000);
  lVar10 = 0;
  lVar14 = 0;
  do {
    lVar19 = 0;
    auVar27 = _DAT_00632fe0;
    do {
      bVar3 = SUB164(auVar27 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar27 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar3) {
        uVar30 = 0x3f800000;
        if (lVar10 != lVar19) {
          uVar30 = 0;
        }
        *(undefined4 *)((long)pfVar7 + lVar19) = uVar30;
      }
      if (bVar3) {
        uVar30 = 0x3f800000;
        if (lVar10 + -0xc != lVar19) {
          uVar30 = 0;
        }
        *(undefined4 *)((long)pfVar7 + lVar19 + 0xc) = uVar30;
      }
      lVar29 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar29 + 2;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x30);
    lVar14 = lVar14 + 1;
    lVar10 = lVar10 + 0xc;
    pfVar7 = pfVar7 + 1;
  } while (lVar14 != 3);
  res.m_data.m_data[2].m_data[0] = (float)(srcX0 - local_1b4);
  res.m_data.m_data[2].m_data[1] = (float)(srcY0 - local_1b8);
  local_88.m_data[1] = (float)iVar20 / (float)iVar21;
  local_88.m_data[0] = (float)iVar23 / (float)iVar22;
  local_88.m_data[2] = 1.0;
  pCVar8 = (ChannelType *)&dst;
  dst.super_ConstPixelBufferAccess.m_format.order = R;
  dst.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  dst.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  dst.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
  dst.super_ConstPixelBufferAccess._16_16_ = ZEXT816(0);
  dst.super_ConstPixelBufferAccess.m_data =
       (void *)((ulong)dst.super_ConstPixelBufferAccess.m_data & 0xffffffff00000000);
  lVar10 = 0;
  lVar14 = 0;
  do {
    lVar19 = 0;
    do {
      fVar25 = 0.0;
      if (lVar10 == lVar19) {
        fVar25 = local_88.m_data[lVar14];
      }
      *(float *)((long)pCVar8 + lVar19) = fVar25;
      lVar19 = lVar19 + 0xc;
    } while (lVar19 != 0x24);
    lVar14 = lVar14 + 1;
    pCVar8 = pCVar8 + 1;
    lVar10 = lVar10 + 0xc;
  } while (lVar14 != 3);
  tcu::operator*((Matrix<float,_3,_3> *)&src_1,&res,(Matrix<float,_3,_3> *)&dst);
  pfVar7 = (float *)&res_1;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar10 = 0;
  lVar14 = 0;
  do {
    lVar19 = 0;
    auVar28 = _DAT_00632fe0;
    do {
      bVar3 = SUB164(auVar28 ^ _DAT_00625ae0,4) == -0x80000000 &&
              SUB164(auVar28 ^ _DAT_00625ae0,0) < -0x7ffffffd;
      if (bVar3) {
        uVar30 = 0x3f800000;
        if (lVar10 != lVar19) {
          uVar30 = 0;
        }
        *(undefined4 *)((long)pfVar7 + lVar19) = uVar30;
      }
      if (bVar3) {
        uVar30 = 0x3f800000;
        if (lVar10 + -0xc != lVar19) {
          uVar30 = 0;
        }
        *(undefined4 *)((long)pfVar7 + lVar19 + 0xc) = uVar30;
      }
      lVar29 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 2;
      auVar28._8_8_ = lVar29 + 2;
      lVar19 = lVar19 + 0x18;
    } while (lVar19 != 0x30);
    lVar14 = lVar14 + 1;
    lVar10 = lVar10 + 0xc;
    pfVar7 = pfVar7 + 1;
  } while (lVar14 != 3);
  res_1.m_data.m_data[2].m_data[0] = (float)(iVar16 - dstX0);
  res_1.m_data.m_data[2].m_data[1] = (float)(iVar18 - dstY0);
  tcu::operator*(&transform,(Matrix<float,_3,_3> *)&src_1,&res_1);
  if (uVar12 == 0) goto LAB_004dbb6c;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&res_1,this);
  rr::MultisamplePixelBufferAccess::toSinglesampleAccess
            (&dst,(MultisamplePixelBufferAccess *)&res_1);
  tcu::getSubregion((PixelBufferAccess *)&src_1,&dst,local_1b4,local_1b8,width,local_1bc);
  res.m_data.m_data[0].m_data[2] = (float)src_1.m_access.m_size.m_data[0];
  res.m_data.m_data[1].m_data[0] = (float)src_1.m_access.m_size.m_data[1];
  res.m_data.m_data[0].m_data[0] = (float)src_1.m_access.m_format.order;
  res.m_data.m_data[0].m_data[1] = (float)src_1.m_access.m_format.type;
  res.m_data.m_data[1].m_data[1] = (float)src_1.m_access.m_size.m_data[2];
  res.m_data.m_data[1].m_data[2] = (float)src_1.m_access.m_pitch.m_data[0];
  res.m_data.m_data[2].m_data[0] = (float)src_1.m_access.m_pitch.m_data[1];
  res.m_data.m_data[2].m_data[1] = (float)src_1.m_access.m_pitch.m_data[2];
  unique0x1000128a = (void *)CONCAT44(src_1.m_access.m_data._4_4_,src_1.m_access.m_data._0_4_);
  getDrawColorbuffer((MultisamplePixelBufferAccess *)&res_1,this);
  rr::MultisamplePixelBufferAccess::toSinglesampleAccess
            ((PixelBufferAccess *)&src_1,(MultisamplePixelBufferAccess *)&res_1);
  tcu::getSubregion(&dst,(PixelBufferAccess *)&src_1,iVar16,iVar18,local_1b0,height);
  TVar6 = tcu::getTextureChannelClass(dst.super_ConstPixelBufferAccess.m_format.type);
  src_1.m_access.m_format.order = R;
  src_1.m_access.m_format.type = SNORM_INT8;
  src_1.m_access.m_size.m_data[0] = 0;
  src_1.m_access.m_size.m_data[1] = (int)(filter == 0x2601 && bVar24);
  src_1.m_access.m_pitch.m_data[0] = 0;
  src_1.m_access.m_pitch.m_data[1] = src_1.m_access.m_pitch.m_data[1] & 0xffffff00;
  src_1.m_access.m_pitch.m_data[2] = 0;
  src_1.m_access.m_data._0_4_ = 0;
  src_1.m_access.m_data._4_4_ = 0;
  src_1.m_access.m_size.m_data[2] = src_1.m_access.m_size.m_data[1];
  bVar24 = tcu::isSRGB((TextureFormat)res.m_data.m_data[0].m_data._0_8_);
  format.type = dst.super_ConstPixelBufferAccess.m_format.type;
  format.order = dst.super_ConstPixelBufferAccess.m_format.order;
  bVar3 = tcu::isSRGB(format);
  if ((this->m_sRGBUpdateEnabled == true) &&
     (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0)) {
    bVar4 = 1;
  }
  else {
    if (res.m_data.m_data[0].m_data[0] == 2.10195e-44) {
      uVar9 = 8;
LAB_004db88d:
      uVar11 = (ulong)res.m_data.m_data[0].m_data._0_8_ >> 0x20;
    }
    else {
      if (res.m_data.m_data[0].m_data[0] == 1.96182e-44) {
        uVar9 = 7;
        goto LAB_004db88d;
      }
      uVar9 = res.m_data.m_data[0].m_data._0_8_ & 0xffffffff;
      uVar11 = (ulong)res.m_data.m_data[0].m_data._0_8_ >> 0x20;
    }
    local_88.m_data._0_8_ = uVar11 << 0x20 | uVar9;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&res_1,(TextureFormat *)&local_88,
               (int)res.m_data.m_data[0].m_data[2],(int)res.m_data.m_data[1].m_data[0],
               (int)res.m_data.m_data[1].m_data[1],(int)res.m_data.m_data[2].m_data[0],
               (int)res.m_data.m_data[2].m_data[1],stack0xfffffffffffffe88);
    unique0x100012d6 = (void *)CONCAT44(uStack_94,res_1.m_data.m_data[2].m_data[2]);
    res.m_data.m_data[1].m_data[1] = res_1.m_data.m_data[1].m_data[1];
    res.m_data.m_data[1].m_data[2] = res_1.m_data.m_data[1].m_data[2];
    res.m_data.m_data[2].m_data[0] = res_1.m_data.m_data[2].m_data[0];
    res.m_data.m_data[2].m_data[1] = res_1.m_data.m_data[2].m_data[1];
    res.m_data.m_data[0].m_data[0] = res_1.m_data.m_data[0].m_data[0];
    res.m_data.m_data[0].m_data[1] = res_1.m_data.m_data[0].m_data[1];
    res.m_data.m_data[0].m_data[2] = res_1.m_data.m_data[0].m_data[2];
    res.m_data.m_data[1].m_data[0] = res_1.m_data.m_data[1].m_data[0];
    if (dst.super_ConstPixelBufferAccess.m_format.order == sRGBA) {
      uVar9 = 8;
    }
    else if (dst.super_ConstPixelBufferAccess.m_format.order == sRGB) {
      uVar9 = 7;
    }
    else {
      uVar9 = (ulong)dst.super_ConstPixelBufferAccess.m_format.order;
    }
    local_88.m_data._0_8_ = (ulong)dst.super_ConstPixelBufferAccess.m_format.type << 0x20 | uVar9;
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res_1,(TextureFormat *)&local_88,
               dst.super_ConstPixelBufferAccess.m_size.m_data[0],
               dst.super_ConstPixelBufferAccess.m_size.m_data[1],
               dst.super_ConstPixelBufferAccess.m_size.m_data[2],
               dst.super_ConstPixelBufferAccess.m_pitch.m_data[1],
               dst.super_ConstPixelBufferAccess.m_pitch.m_data[2],
               dst.super_ConstPixelBufferAccess.m_data);
    dst.super_ConstPixelBufferAccess.m_data =
         (void *)CONCAT44(uStack_94,res_1.m_data.m_data[2].m_data[2]);
    dst.super_ConstPixelBufferAccess.m_size.m_data[0] = (int)res_1.m_data.m_data[0].m_data[2];
    dst.super_ConstPixelBufferAccess.m_size.m_data[1] = (int)res_1.m_data.m_data[1].m_data[0];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[1] = (int)res_1.m_data.m_data[2].m_data[0];
    dst.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)res_1.m_data.m_data[1].m_data[1];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] = res_1.m_data.m_data[1].m_data[2];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] = (int)res_1.m_data.m_data[2].m_data[1];
    dst.super_ConstPixelBufferAccess.m_format.order = res_1.m_data.m_data[0].m_data[0];
    dst.super_ConstPixelBufferAccess.m_format.type = res_1.m_data.m_data[0].m_data[1];
    bVar4 = 0;
  }
  if (0 < height) {
    iVar21 = 0;
    do {
      if (0 < local_1b0) {
        iVar22 = 0;
        do {
          fVar25 = ((float)iVar22 + 0.5) * transform.m_data.m_data[0].m_data[0] +
                   transform.m_data.m_data[1].m_data[0] * ((float)iVar21 + 0.5) +
                   transform.m_data.m_data[2].m_data[0];
          fVar26 = ((float)iVar22 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                   transform.m_data.m_data[1].m_data[1] * ((float)iVar21 + 0.5) +
                   transform.m_data.m_data[2].m_data[1];
          if (((0.0 <= fVar25) && (fVar25 < (float)width)) &&
             ((0.0 <= fVar26 && (fVar26 < (float)local_1bc)))) {
            if ((filter == 1 || bVar24) ||
                (TVar6 < TEXTURECHANNELCLASS_LAST & 0x13U >> ((byte)TVar6 & 0x1f)) != 0) {
              tcu::ConstPixelBufferAccess::sample2D
                        ((ConstPixelBufferAccess *)&res_1,(Sampler *)&res,(FilterMode)&src_1,fVar25,
                         fVar26,src_1.m_access.m_size.m_data[1]);
              if ((bVar3 & bVar4) == 0) {
                local_88.m_data[0] = res_1.m_data.m_data[0].m_data[0];
                local_88.m_data[1] = res_1.m_data.m_data[0].m_data[1];
                local_88.m_data[2] = res_1.m_data.m_data[0].m_data[2];
                local_88.m_data[3] = res_1.m_data.m_data[1].m_data[0];
              }
              else {
                tcu::linearToSRGB((tcu *)&local_88,(Vec4 *)&res_1);
              }
              tcu::PixelBufferAccess::setPixel(&dst,&local_88,iVar22,iVar21,0);
            }
            else {
              fVar25 = floorf(fVar25);
              fVar26 = floorf(fVar26);
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)&res_1,(int)&res,(int)fVar25,(int)fVar26);
              tcu::PixelBufferAccess::setPixel(&dst,(IVec4 *)&res_1,iVar22,iVar21,0);
            }
          }
          iVar22 = iVar22 + 1;
        } while (local_1b0 != iVar22);
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 != height);
  }
LAB_004dbb6c:
  if (((mask >> 8 & 1) != 0) && (this->m_depthMask == true)) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&res_1,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                     local_1b4,local_1b8,width,local_1bc);
    getDepthMultisampleAccess
              ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src_1,(MultisamplePixelBufferAccess *)&res);
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&res_1,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                     iVar16,iVar18,local_1b0,height);
    getDepthMultisampleAccess
              ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
    if (0 < height) {
      iVar21 = 0;
      do {
        if (0 < local_1b0) {
          iVar22 = 0;
          do {
            fVar25 = floorf(transform.m_data.m_data[0].m_data[0] * ((float)iVar22 + 0.5) +
                            transform.m_data.m_data[1].m_data[0] * ((float)iVar21 + 0.5) +
                            transform.m_data.m_data[2].m_data[0]);
            fVar26 = floorf(((float)iVar22 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                            transform.m_data.m_data[1].m_data[1] * ((float)iVar21 + 0.5) +
                            transform.m_data.m_data[2].m_data[1]);
            fVar25 = tcu::ConstPixelBufferAccess::getPixDepth
                               (&src_1.m_access,0,(int)fVar25,(int)fVar26);
            tcu::PixelBufferAccess::setPixDepth((PixelBufferAccess *)&res,fVar25,0,iVar22,iVar21);
            iVar22 = iVar22 + 1;
          } while (local_1b0 != iVar22);
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 != height);
    }
  }
  if ((mask >> 10 & 1) == 0) {
    return;
  }
  getReadStencilbuffer((MultisamplePixelBufferAccess *)&res_1,this);
  rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                   local_1b4,local_1b8,width,local_1bc);
  getStencilMultisampleAccess
            ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&src_1,(MultisamplePixelBufferAccess *)&res);
  getDrawStencilbuffer((MultisamplePixelBufferAccess *)&res_1,this);
  rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&res_1,
                   iVar16,iVar18,local_1b0,height);
  getStencilMultisampleAccess
            ((MultisamplePixelBufferAccess *)&res,(MultisamplePixelBufferAccess *)&dst);
  if (height < 1) {
    return;
  }
  iVar16 = 0;
  do {
    if (0 < local_1b0) {
      iVar21 = 0;
      do {
        fVar26 = ((float)iVar21 + 0.5) * transform.m_data.m_data[0].m_data[1] +
                 transform.m_data.m_data[1].m_data[1] * ((float)iVar16 + 0.5) +
                 transform.m_data.m_data[2].m_data[1];
        fVar25 = floorf(transform.m_data.m_data[0].m_data[0] * ((float)iVar21 + 0.5) +
                        transform.m_data.m_data[1].m_data[0] * ((float)iVar16 + 0.5) +
                        transform.m_data.m_data[2].m_data[0]);
        floorf(fVar26);
        tcu::ConstPixelBufferAccess::getPixelInt
                  (&dst.super_ConstPixelBufferAccess,(int)&src_1,0,(int)fVar25);
        CVar2 = dst.super_ConstPixelBufferAccess.m_format.order;
        CVar1 = this->m_stencil[0].writeMask;
        tcu::ConstPixelBufferAccess::getPixelInt
                  (&dst.super_ConstPixelBufferAccess,(int)(PixelBufferAccess *)&res,0,iVar21);
        dst.super_ConstPixelBufferAccess.m_format.order =
             (CVar2 ^ dst.super_ConstPixelBufferAccess.m_format.order) & CVar1 ^
             dst.super_ConstPixelBufferAccess.m_format.order;
        dst.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        dst.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        dst.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&res,(IVec4 *)&dst.super_ConstPixelBufferAccess,0,iVar21,
                   iVar16);
        iVar21 = iVar21 + 1;
      } while (local_1b0 != iVar21);
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != height);
  return;
}

Assistant:

void ReferenceContext::blitFramebuffer (int srcX0, int srcY0, int srcX1, int srcY1, int dstX0, int dstY0, int dstX1, int dstY1, deUint32 mask, deUint32 filter)
{
	// p0 in inclusive, p1 exclusive.
	// Negative width/height means swap.
	bool	swapSrcX	= srcX1 < srcX0;
	bool	swapSrcY	= srcY1 < srcY0;
	bool	swapDstX	= dstX1 < dstX0;
	bool	swapDstY	= dstY1 < dstY0;
	int		srcW		= de::abs(srcX1-srcX0);
	int		srcH		= de::abs(srcY1-srcY0);
	int		dstW		= de::abs(dstX1-dstX0);
	int		dstH		= de::abs(dstY1-dstY0);
	bool	scale		= srcW != dstW || srcH != dstH;
	int		srcOriginX	= swapSrcX ? srcX1 : srcX0;
	int		srcOriginY	= swapSrcY ? srcY1 : srcY0;
	int		dstOriginX	= swapDstX ? dstX1 : dstX0;
	int		dstOriginY	= swapDstY ? dstY1 : dstY0;
	IVec4	srcRect		= IVec4(srcOriginX, srcOriginY, srcW, srcH);
	IVec4	dstRect		= IVec4(dstOriginX, dstOriginY, dstW, dstH);

	RC_IF_ERROR(filter != GL_NEAREST && filter != GL_LINEAR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((mask & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) != 0 && filter != GL_NEAREST, GL_INVALID_OPERATION, RC_RET_VOID);

	// Validate that both targets are complete.
	RC_IF_ERROR(checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE ||
				checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check samples count is valid
	RC_IF_ERROR(getDrawColorbuffer().getNumSamples() != 1, GL_INVALID_OPERATION, RC_RET_VOID);

	// Check size restrictions of multisampled case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		// Src and Dst rect dimensions must be the same
		RC_IF_ERROR(srcW != dstW || srcH != dstH, GL_INVALID_OPERATION, RC_RET_VOID);

		// Framebuffer formats must match
		if (mask & GL_COLOR_BUFFER_BIT)		RC_IF_ERROR(getReadColorbuffer().raw().getFormat()   != getDrawColorbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_DEPTH_BUFFER_BIT)		RC_IF_ERROR(getReadDepthbuffer().raw().getFormat()   != getDrawDepthbuffer().raw().getFormat(),   GL_INVALID_OPERATION, RC_RET_VOID);
		if (mask & GL_STENCIL_BUFFER_BIT)	RC_IF_ERROR(getReadStencilbuffer().raw().getFormat() != getDrawStencilbuffer().raw().getFormat(), GL_INVALID_OPERATION, RC_RET_VOID);
	}

	// Compute actual source rect.
	srcRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadColorbuffer()))	: srcRect;
	srcRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(srcRect, getBufferRect(getReadDepthbuffer()))	: srcRect;
	srcRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(srcRect, getBufferRect(getReadStencilbuffer()))	: srcRect;

	// Compute destination rect.
	dstRect = (mask & GL_COLOR_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawColorbuffer()))	: dstRect;
	dstRect = (mask & GL_DEPTH_BUFFER_BIT)		? intersect(dstRect, getBufferRect(getDrawDepthbuffer()))	: dstRect;
	dstRect = (mask & GL_STENCIL_BUFFER_BIT)	? intersect(dstRect, getBufferRect(getDrawStencilbuffer()))	: dstRect;
	dstRect = m_scissorEnabled					? intersect(dstRect, m_scissorBox)							: dstRect;

	if (isEmpty(srcRect) || isEmpty(dstRect))
		return; // Don't attempt copy.

	// Multisampled read buffer is a special case
	if (getReadColorbuffer().getNumSamples() != 1)
	{
		deUint32 error = blitResolveMultisampleFramebuffer(mask, srcRect, dstRect, swapSrcX ^ swapDstX, swapSrcY ^ swapDstY);

		if (error != GL_NO_ERROR)
			setError(error);

		return;
	}

	// \note Multisample pixel buffers can now be accessed like non-multisampled because multisample read buffer case is already handled. => sample count must be 1

	// Coordinate transformation:
	// Dst offset space -> dst rectangle space -> src rectangle space -> src offset space.
	tcu::Mat3 transform = tcu::translationMatrix(Vec2((float)(srcX0 - srcRect.x()), (float)(srcY0 - srcRect.y())))
						* tcu::Mat3(Vec3((float)(srcX1-srcX0) / (float)(dstX1-dstX0),
										 (float)(srcY1-srcY0) / (float)(dstY1-dstY0),
										 1.0f))
						* tcu::translationMatrix(Vec2((float)(dstRect.x() - dstX0), (float)(dstRect.y() - dstY0)));

	if (mask & GL_COLOR_BUFFER_BIT)
	{
		tcu::ConstPixelBufferAccess		src			= tcu::getSubregion(getReadColorbuffer().toSinglesampleAccess(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess			dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass		dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool							dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
													  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
													  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		tcu::Sampler::FilterMode		sFilter		= (scale && filter == GL_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;
		tcu::Sampler					sampler		(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
													 sFilter, sFilter, 0.0f /* lod threshold */, false /* non-normalized coords */);
		bool							srcIsSRGB	= tcu::isSRGB(src.getFormat());
		bool							dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool						convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			src	= tcu::ConstPixelBufferAccess	(toNonSRGBFormat(src.getFormat()), src.getWidth(), src.getHeight(), src.getDepth(), src.getRowPitch(), src.getSlicePitch(), src.getDataPtr());
			dst	= tcu::PixelBufferAccess		(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		// \note We don't check for unsupported conversions, unlike spec requires.

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;

				// \note Only affine part is used.
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				// do not copy pixels outside the modified source region (modified by buffer intersection)
				if (sX < 0.0f || sX >= (float)srcRect.z() ||
					sY < 0.0f || sY >= (float)srcRect.w())
					continue;

				if (dstIsFloat || srcIsSRGB || filter == tcu::Sampler::LINEAR)
				{
					Vec4 p = src.sample2D(sampler, sampler.minFilter, sX, sY, 0);
					dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, xo, yo);
				}
				else
					dst.setPixel(src.getPixelInt(deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)), xo, yo);
			}
		}
	}

	if ((mask & GL_DEPTH_BUFFER_BIT) && m_depthMask)
	{
		rr::MultisampleConstPixelBufferAccess	src		= getDepthMultisampleAccess(rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst		= getDepthMultisampleAccess(rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int sampleNdx = 0; // multisample read buffer case is already handled

				float	dX	= (float)xo + 0.5f;
				float	dY	= (float)yo + 0.5f;
				float	sX	= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float	sY	= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);

				writeDepthOnly(dst, sampleNdx, xo, yo, src.raw().getPixDepth(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)));
			}
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int yo = 0; yo < dstRect.w(); yo++)
		{
			for (int xo = 0; xo < dstRect.z(); xo++)
			{
				const int	sampleNdx = 0; // multisample read buffer case is already handled

				float		dX			= (float)xo + 0.5f;
				float		dY			= (float)yo + 0.5f;
				float		sX			= transform(0, 0)*dX + transform(0, 1)*dY + transform(0, 2);
				float		sY			= transform(1, 0)*dX + transform(1, 1)*dY + transform(1, 2);
				deUint32	srcStencil	= src.raw().getPixelUint(sampleNdx, deFloorFloatToInt32(sX), deFloorFloatToInt32(sY)).x();

				writeMaskedStencil(dst, sampleNdx, xo, yo, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
			}
		}
	}
}